

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::getCode(int po,int rlc,longlong *c,int *lc,char **in,char *in_end,unsigned_short **out
                     ,unsigned_short *ob,unsigned_short *oe)

{
  unsigned_short uVar1;
  byte *pbVar2;
  long lVar3;
  int iVar4;
  unsigned_short *puVar5;
  byte bVar6;
  ulong uVar7;
  
  if (po == rlc) {
    iVar4 = *lc;
    if (iVar4 < 8) {
      pbVar2 = (byte *)*in;
      if (in_end <= pbVar2) {
        return false;
      }
      lVar3 = *c;
      *in = (char *)(pbVar2 + 1);
      *c = (ulong)*pbVar2 | lVar3 << 8;
      iVar4 = *lc + 8;
    }
    *lc = iVar4 + -8;
    uVar7 = *c >> ((byte)(iVar4 + -8) & 0x3f);
    if ((*out + (uVar7 & 0xff) <= oe) && (puVar5 = *out + -1, ob <= puVar5)) {
      if ((char)uVar7 != '\0') {
        uVar1 = *puVar5;
        do {
          puVar5 = *out;
          *out = puVar5 + 1;
          *puVar5 = uVar1;
          bVar6 = (char)uVar7 - 1;
          uVar7 = (ulong)bVar6;
        } while (bVar6 != 0);
      }
      return true;
    }
  }
  else {
    puVar5 = *out;
    if (puVar5 < oe) {
      *out = puVar5 + 1;
      *puVar5 = (unsigned_short)po;
      return true;
    }
  }
  return false;
}

Assistant:

static bool getCode(int po, int rlc, long long &c, int &lc, const char *&in,
                    const char *in_end, unsigned short *&out,
                    const unsigned short *ob, const unsigned short *oe) {
  (void)ob;
  if (po == rlc) {
    if (lc < 8) {
      /* TinyEXR issue 78 */
      /* TinyEXR issue 160. in + 1 -> in */
      if (in >= in_end) {
        return false;
      }

      getChar(c, lc, in);
    }

    lc -= 8;

    unsigned char cs = (c >> lc);

    if (out + cs > oe) return false;

    // Bounds check for safety
    // Issue 100.
    if ((out - 1) < ob) return false;
    unsigned short s = out[-1];

    while (cs-- > 0) *out++ = s;
  } else if (out < oe) {
    *out++ = po;
  } else {
    return false;
  }
  return true;
}